

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O2

antecedentConsequentVectorsStruct * allocAntecedentConsequentVectorsStruct(void)

{
  antecedentConsequentVectorsStruct *paVar1;
  
  paVar1 = (antecedentConsequentVectorsStruct *)calloc(1,0x10);
  return paVar1;
}

Assistant:

struct antecedentConsequentVectorsStruct *allocAntecedentConsequentVectorsStruct()
{
	struct antecedentConsequentVectorsStruct *newStructure;

	newStructure = (struct antecedentConsequentVectorsStruct *)malloc(sizeof (struct antecedentConsequentVectorsStruct));

	newStructure->attrAntecedents = NULL;
	newStructure->attrConsequentCandidates = NULL;
		
	assert( newStructure != NULL );
	return newStructure;
}